

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

us_timer_t * us_create_timer(us_loop_t *loop,int fallthrough,uint ext_size)

{
  int fd;
  us_timer_t *puVar1;
  undefined8 in_RDI;
  us_internal_callback_t *cb;
  us_poll_t *p;
  undefined8 in_stack_ffffffffffffffd8;
  us_timer_t *p_00;
  us_loop_t *in_stack_ffffffffffffffe0;
  
  puVar1 = (us_timer_t *)
           us_create_poll(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (uint)in_stack_ffffffffffffffd8);
  p_00 = puVar1;
  fd = timerfd_create(0,0x80800);
  us_poll_init((us_poll_t *)p_00,fd,3);
  *(undefined8 *)(puVar1 + 0x10) = in_RDI;
  *(undefined4 *)(puVar1 + 0x18) = 0;
  return puVar1;
}

Assistant:

struct us_timer_t *us_create_timer(struct us_loop_t *loop, int fallthrough, unsigned int ext_size) {
    struct us_poll_t *p = us_create_poll(loop, fallthrough, sizeof(struct us_internal_callback_t) + ext_size);
    us_poll_init(p, timerfd_create(CLOCK_REALTIME, TFD_NONBLOCK | TFD_CLOEXEC), POLL_TYPE_CALLBACK);

    struct us_internal_callback_t *cb = (struct us_internal_callback_t *) p;
    cb->loop = loop;
    cb->cb_expects_the_loop = 0;

    return (struct us_timer_t *) cb;
}